

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O2

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitCallIndirect(InternalAnalyzer *this,CallIndirect *curr)

{
  EffectAnalyzer *pEVar1;
  
  pEVar1 = this->parent;
  pEVar1->calls = true;
  if (curr[0x50] == (CallIndirect)0x1) {
    pEVar1->branchesOut = true;
    if (((pEVar1->features).features & 0x40) != 0) {
      pEVar1->hasReturnCallThrow = true;
    }
  }
  else if ((((pEVar1->features).features & 0x40) != 0) &&
          (pEVar1->tryDepth == 0 && curr[0x50] == (CallIndirect)0x0)) {
    pEVar1->throws_ = true;
  }
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
      parent.calls = true;
      if (curr->isReturn) {
        parent.branchesOut = true;
        if (parent.features.hasExceptionHandling()) {
          parent.hasReturnCallThrow = true;
        }
      }
      if (parent.features.hasExceptionHandling() &&
          (parent.tryDepth == 0 && !curr->isReturn)) {
        parent.throws_ = true;
      }
    }